

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O1

char * ngx_http_uwsgi_pass(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long *plVar1;
  void *pvVar2;
  ngx_int_t nVar3;
  ngx_http_upstream_srv_conf_t *pnVar4;
  ngx_http_uwsgi_loc_conf_t *uwcf;
  long lVar5;
  undefined1 auStack_108 [8];
  ngx_url_t u;
  
  if (*conf != 0) {
    return "is duplicate";
  }
  if (*(long *)((long)conf + 0x220) != 0) {
    return "is duplicate";
  }
  plVar1 = *(long **)(*(long *)((long)cf->ctx + 0x10) + ngx_http_core_module.ctx_index * 8);
  plVar1[9] = (long)ngx_http_uwsgi_handler;
  pvVar2 = cf->args->elts;
  u.port_text.len = ngx_http_script_variables_count((ngx_str_t *)((long)pvVar2 + 0x10));
  if (u.port_text.len != 0) {
    u.host.len = (long)conf + 0x220;
    u.url.data = (u_char *)0x0;
    u.uri.data = (u_char *)0x0;
    u.port = 0;
    u.default_port = 0;
    u.family = 0;
    u.port_text.data = (u_char *)0x0;
    u.uri.len = 0;
    u.host.data = (u_char *)((long)conf + 0x228);
    u._72_4_ = 6;
    u.socklen = 0;
    auStack_108 = (undefined1  [8])cf;
    u.url.len = (size_t)((long)pvVar2 + 0x10);
    nVar3 = ngx_http_script_compile((ngx_http_script_compile_t *)auStack_108);
    return (char *)-(ulong)(nVar3 != 0);
  }
  lVar5 = 8;
  nVar3 = ngx_strncasecmp(*(u_char **)((long)pvVar2 + 0x18),"uwsgi://",8);
  if (nVar3 != 0) {
    nVar3 = ngx_strncasecmp(*(u_char **)((long)pvVar2 + 0x18),(u_char *)"suwsgi://",9);
    if (nVar3 == 0) {
      ngx_conf_log_error(1,cf,0,"suwsgi protocol requires SSL support");
      return (char *)0xffffffffffffffff;
    }
    lVar5 = 0;
  }
  memset(auStack_108,0,0xd8);
  auStack_108 = (undefined1  [8])(*(long *)((long)pvVar2 + 0x10) - lVar5);
  u.url.len = lVar5 + *(long *)((long)pvVar2 + 0x18);
  u._64_8_ = u._64_8_ | 4;
  pnVar4 = ngx_http_upstream_add(cf,(ngx_url_t *)auStack_108,0);
  *(ngx_http_upstream_srv_conf_t **)conf = pnVar4;
  if (pnVar4 == (ngx_http_upstream_srv_conf_t *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  if (*(char *)(plVar1[1] + -1 + *plVar1) == '/') {
    *(byte *)(plVar1 + 3) = *(byte *)(plVar1 + 3) | 0x20;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_uwsgi_pass(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    size_t                      add;
    ngx_url_t                   u;
    ngx_str_t                  *value, *url;
    ngx_uint_t                  n;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_script_compile_t   sc;

    if (uwcf->upstream.upstream || uwcf->uwsgi_lengths) {
        return "is duplicate";
    }

    clcf = ngx_http_conf_get_module_loc_conf(cf, ngx_http_core_module);
    clcf->handler = ngx_http_uwsgi_handler;

    value = cf->args->elts;

    url = &value[1];

    n = ngx_http_script_variables_count(url);

    if (n) {

        ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

        sc.cf = cf;
        sc.source = url;
        sc.lengths = &uwcf->uwsgi_lengths;
        sc.values = &uwcf->uwsgi_values;
        sc.variables = n;
        sc.complete_lengths = 1;
        sc.complete_values = 1;

        if (ngx_http_script_compile(&sc) != NGX_OK) {
            return NGX_CONF_ERROR;
        }

#if (NGX_HTTP_SSL)
        uwcf->ssl = 1;
#endif

        return NGX_CONF_OK;
    }

    if (ngx_strncasecmp(url->data, (u_char *) "uwsgi://", 8) == 0) {
        add = 8;

    } else if (ngx_strncasecmp(url->data, (u_char *) "suwsgi://", 9) == 0) {

#if (NGX_HTTP_SSL)
        add = 9;
        uwcf->ssl = 1;
#else
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "suwsgi protocol requires SSL support");
        return NGX_CONF_ERROR;
#endif

    } else {
        add = 0;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url.len = url->len - add;
    u.url.data = url->data + add;
    u.no_resolve = 1;

    uwcf->upstream.upstream = ngx_http_upstream_add(cf, &u, 0);
    if (uwcf->upstream.upstream == NULL) {
        return NGX_CONF_ERROR;
    }

    if (clcf->name.data[clcf->name.len - 1] == '/') {
        clcf->auto_redirect = 1;
    }

    return NGX_CONF_OK;
}